

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.h
# Opt level: O0

void __thiscall Database<Protein>::Database(Database<Protein> *this,size_t kmerLength)

{
  anon_class_1_0_00000001 local_19;
  size_t local_18;
  size_t kmerLength_local;
  Database<Protein> *this_local;
  
  this->mKmerLength = kmerLength;
  local_18 = kmerLength;
  kmerLength_local = (size_t)this;
  std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>::deque(&this->mSequences);
  this->mMaxUniqueKmers = (long)(1 << ((byte)((this->mKmerLength & 0x3fffffff) << 2) & 0x1f));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->mSequenceIdsOffsetByKmer);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->mSequenceIdsCountByKmer)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->mSequenceIds);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->mKmerOffsetBySequenceId)
  ;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->mKmerCountBySequenceId);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->mKmers);
  std::function<void(Database<Protein>::ProgressType,unsigned_long,unsigned_long)>::
  function<Database<Protein>::function(unsigned_long)::_lambda(Database<Protein>::ProgressType,unsigned_long,unsigned_long)_1_,void>
            ((function<void(Database<Protein>::ProgressType,unsigned_long,unsigned_long)> *)
             &this->mProgressCallback,&local_19);
  if (this->mKmerLength << 2 < 0x21) {
    return;
  }
  __assert_fail("BitMapPolicy< A >::NumBits * mKmerLength <= sizeof( Kmer ) * 8",
                "/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/libnsearch/include/nsearch/Database.h"
                ,0x42,"Database<Protein>::Database(const size_t) [Alphabet = Protein]");
}

Assistant:

Database< A >::Database( const size_t kmerLength )
    : mKmerLength( kmerLength ),
      mProgressCallback( []( ProgressType, const size_t, const size_t ) {} ),
      mMaxUniqueKmers( 1 << ( BitMapPolicy< A >::NumBits * mKmerLength ) )
{
  assert( BitMapPolicy< A >::NumBits * mKmerLength <= sizeof( Kmer ) * 8 );
}